

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UVector::indexOf(UVector *this,UElement key,int32_t startIndex,int8_t hint)

{
  UBool UVar1;
  UElement *pUVar2;
  long lVar3;
  
  if (this->comparer == (UElementsAreEqual *)0x0) {
    if (startIndex < this->count) {
      pUVar2 = this->elements + startIndex;
      do {
        if ((hint & 1U) == 0) {
          if (pUVar2->integer == key.integer) {
            return startIndex;
          }
        }
        else if (pUVar2->pointer == key.pointer) {
          return startIndex;
        }
        startIndex = startIndex + 1;
        pUVar2 = pUVar2 + 1;
      } while (this->count != startIndex);
    }
  }
  else if (startIndex < this->count) {
    lVar3 = (long)startIndex;
    do {
      UVar1 = (*this->comparer)((UElement)key.pointer,(UElement)this->elements[lVar3].pointer);
      if (UVar1 != '\0') {
        return (int32_t)lVar3;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->count);
  }
  return -1;
}

Assistant:

int32_t UVector::indexOf(UElement key, int32_t startIndex, int8_t hint) const {
    int32_t i;
    if (comparer != 0) {
        for (i=startIndex; i<count; ++i) {
            if ((*comparer)(key, elements[i])) {
                return i;
            }
        }
    } else {
        for (i=startIndex; i<count; ++i) {
            /* Pointers are not always the same size as ints so to perform
             * a valid comparision we need to know whether we are being
             * provided an int or a pointer. */
            if (hint & HINT_KEY_POINTER) {
                if (key.pointer == elements[i].pointer) {
                    return i;
                }
            } else {
                if (key.integer == elements[i].integer) {
                    return i;
                }
            }
        }
    }
    return -1;
}